

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TilesBoard.cpp
# Opt level: O3

void __thiscall
TilesBoard::createTiles(TilesBoard *this,size_t boardSize,size_t tileSize,QMainWindow *window)

{
  vector<QHBoxLayout_*,_std::allocator<QHBoxLayout_*>_> *this_00;
  _Head_base<0UL,_QPushButton_*,_false> _Var1;
  TilesBoard *pTVar2;
  code *pcVar3;
  undefined8 uVar4;
  QHBoxLayout *this_01;
  QPushButton *this_02;
  undefined4 *puVar5;
  size_t sVar6;
  size_t sVar7;
  _Head_base<0UL,_QPushButton_*,_false> local_d0;
  TilesBoard *local_c8;
  QString t;
  QArrayData *local_98;
  char16_t *local_90;
  qsizetype qStack_88;
  function<void_()> *local_80;
  QMainWindow *local_78;
  _Any_data local_70;
  code *local_60;
  undefined8 uStack_58;
  QObject local_50 [8];
  QArrayData *local_48 [3];
  
  local_78 = window;
  deleteTiles(this);
  local_c8 = this;
  QBoxLayout::addStretch((int)this->verticalLayout);
  if (boardSize != 0) {
    this_00 = &local_c8->horizontalLayouts;
    local_80 = &local_c8->pressTileSlot;
    sVar6 = 0;
    do {
      this_01 = (QHBoxLayout *)operator_new(0x20);
      QHBoxLayout::QHBoxLayout(this_01);
      t.d.d = (Data *)this_01;
      std::vector<QHBoxLayout*,std::allocator<QHBoxLayout*>>::emplace_back<QHBoxLayout*>
                ((vector<QHBoxLayout*,std::allocator<QHBoxLayout*>> *)this_00,(QHBoxLayout **)&t);
      (**(code **)(*(long *)(this_00->
                            super__Vector_base<QHBoxLayout_*,_std::allocator<QHBoxLayout_*>_>).
                            _M_impl.super__Vector_impl_data._M_start[sVar6] + 0x68))();
      QBoxLayout::addStretch
                ((int)(this_00->super__Vector_base<QHBoxLayout_*,_std::allocator<QHBoxLayout_*>_>).
                      _M_impl.super__Vector_impl_data._M_start[sVar6]);
      sVar7 = 0;
      do {
        this_02 = (QPushButton *)operator_new(0x28);
        QPushButton::QPushButton(this_02,(QWidget *)0x0);
        local_d0._M_head_impl = this_02;
        QString::number((ulong)&local_98,(int)sVar6);
        QString::number((ulong)local_48,(int)sVar7);
        t.d.d = (Data *)local_98;
        t.d.ptr = local_90;
        t.d.size = qStack_88;
        if (local_98 != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)&local_98->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
               (((QArrayData *)&local_98->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QString::append(&t);
        QWidget::setAccessibleName((QString *)this_02);
        if (t.d.d != (Data *)0x0) {
          LOCK();
          ((t.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((t.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((t.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(t.d.d)->super_QArrayData,2,8);
          }
        }
        if (local_48[0] != (QArrayData *)0x0) {
          LOCK();
          (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_48[0],2,8);
          }
        }
        if (local_98 != (QArrayData *)0x0) {
          LOCK();
          (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_98,2,8);
          }
        }
        QWidget::setMaximumSize((int)local_d0._M_head_impl,(int)tileSize);
        QWidget::setMinimumSize((int)local_d0._M_head_impl,(int)tileSize);
        _Var1._M_head_impl = local_d0._M_head_impl;
        std::function<void_()>::function((function<void_()> *)&local_70,local_80);
        t.d.d = (Data *)QAbstractButton::clicked;
        t.d.ptr = (char16_t *)0x0;
        puVar5 = (undefined4 *)operator_new(0x30);
        uVar4 = uStack_58;
        pcVar3 = local_60;
        if (local_60 == (code *)0x0) {
          *(undefined8 *)(puVar5 + 4) = 0;
          *(undefined8 *)(puVar5 + 6) = 0;
          *(undefined8 *)(puVar5 + 8) = 0;
        }
        else {
          local_60 = (code *)0x0;
          uStack_58 = 0;
          *(void **)(puVar5 + 4) = local_70._M_unused._M_object;
          *(undefined8 *)(puVar5 + 6) = local_70._8_8_;
          *(code **)(puVar5 + 8) = pcVar3;
        }
        *puVar5 = 1;
        *(code **)(puVar5 + 2) =
             QtPrivate::QFunctorSlotObject<std::function<void_()>,_0,_QtPrivate::List<>,_void>::impl
        ;
        *(undefined8 *)(puVar5 + 10) = uVar4;
        QObject::connectImpl
                  (local_50,(void **)_Var1._M_head_impl,(QObject *)&t,(void **)local_78,
                   (QSlotObjectBase *)0x0,(ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
        QMetaObject::Connection::~Connection((Connection *)local_50);
        if (local_60 != (code *)0x0) {
          (*local_60)(&local_70,&local_70,__destroy_functor);
        }
        QBoxLayout::addWidget
                  ((this_00->super__Vector_base<QHBoxLayout_*,_std::allocator<QHBoxLayout_*>_>).
                   _M_impl.super__Vector_impl_data._M_start[sVar6],local_d0._M_head_impl,0,0);
        std::
        vector<std::unique_ptr<QPushButton,std::default_delete<QPushButton>>,std::allocator<std::unique_ptr<QPushButton,std::default_delete<QPushButton>>>>
        ::emplace_back<std::unique_ptr<QPushButton,std::default_delete<QPushButton>>>
                  ((vector<std::unique_ptr<QPushButton,std::default_delete<QPushButton>>,std::allocator<std::unique_ptr<QPushButton,std::default_delete<QPushButton>>>>
                    *)local_c8,
                   (unique_ptr<QPushButton,_std::default_delete<QPushButton>_> *)&local_d0);
        if (local_d0._M_head_impl != (QPushButton *)0x0) {
          (**(code **)(*(long *)local_d0._M_head_impl + 0x20))();
        }
        pTVar2 = local_c8;
        sVar7 = sVar7 + 1;
      } while (boardSize != sVar7);
      QBoxLayout::addStretch
                ((int)(local_c8->horizontalLayouts).
                      super__Vector_base<QHBoxLayout_*,_std::allocator<QHBoxLayout_*>_>._M_impl.
                      super__Vector_impl_data._M_start[sVar6]);
      QBoxLayout::addLayout
                ((QLayout *)pTVar2->verticalLayout,
                 (int)(pTVar2->horizontalLayouts).
                      super__Vector_base<QHBoxLayout_*,_std::allocator<QHBoxLayout_*>_>._M_impl.
                      super__Vector_impl_data._M_start[sVar6]);
      sVar6 = sVar6 + 1;
    } while (sVar6 != boardSize);
  }
  QBoxLayout::addStretch((int)local_c8->verticalLayout);
  return;
}

Assistant:

void TilesBoard::createTiles( size_t boardSize, size_t tileSize, QMainWindow* window )
{
    deleteTiles();
    verticalLayout->addStretch();

    for ( size_t row = 0; row < boardSize; row++ )
    {
        horizontalLayouts.emplace_back( new QHBoxLayout() );
        horizontalLayouts[row]->setSpacing(0);
        horizontalLayouts[row]->addStretch();

        for ( size_t col = 0; col < boardSize; col++ )
        {
            auto tile = std::make_unique<QPushButton>();
            tile->setAccessibleName( QString::number( row ) + QString::number( col ));
            tile->setMaximumSize( tileSize, tileSize );
            tile->setMinimumSize( tileSize, tileSize );
            QObject::connect( tile.get(), &QPushButton::clicked, window, pressTileSlot );
            horizontalLayouts[row]->addWidget( tile.get() );
            tiles.push_back( std::move( tile ));
        }

        horizontalLayouts[row]->addStretch();
        verticalLayout->addLayout( horizontalLayouts[row] );
    }
    verticalLayout->addStretch();
}